

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<DataStream,int,unsigned_int,CKeyID>
               (DataStream *s,int *args,uint *args_1,CKeyID *args_2)

{
  long lVar1;
  DataStream *in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream>(in_RCX,0);
  Serialize<DataStream>(in_RCX,0);
  Serialize<DataStream,_CKeyID>(in_RCX,(CKeyID *)0x3224c9);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}